

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void anon_unknown.dwarf_6260c::test_default_construction<int>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_int_&> EVar3;
  int local_5e8;
  value_type_conflict local_5e4;
  ExpressionLhs<const_int_&> local_5e0;
  SourceLineInfo local_5d0;
  undefined1 local_5a8 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_int_&> local_300 [2];
  SourceLineInfo local_2e0;
  undefined1 local_2b8 [8];
  ResultBuilder __catchResult;
  rational r2;
  rational r1;
  
  memset(&__catchResult.m_shouldDebugBreak,0,8);
  tcb::rational<int>::rational((rational<int> *)&__catchResult.m_shouldDebugBreak);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x18);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b8,"REQUIRE",&local_2e0,"r2.num() == 0",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2e0);
    __catchResult_1._668_4_ =
         tcb::rational<int>::num((rational<int> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)local_2b8,(int *)&__catchResult_1.field_0x29c);
    __catchResult_1.m_shouldDebugBreak = false;
    __catchResult_1.m_shouldThrow = false;
    __catchResult_1._666_2_ = 0;
    local_300[0] = EVar3;
    pRVar2 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)local_300,
                        (int *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x19);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5a8,"REQUIRE",&local_5d0,"r2.denom() == 1",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_5d0);
    local_5e4 = tcb::rational<int>::denom((rational<int> *)&__catchResult.m_shouldDebugBreak);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5a8,&local_5e4);
    local_5e8 = 1;
    local_5e0 = EVar3;
    pRVar2 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)&local_5e0,&local_5e8);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5a8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5a8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5a8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_default_construction()
{
    using rational = tcb::rational<T>;

    constexpr rational r1{};
    static_assert(r1.num() == 0, "");
    static_assert(r1.denom() == 1, "");

    const rational r2{};
    REQUIRE(r2.num() == 0);
    REQUIRE(r2.denom() == 1);
}